

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bitmap.cpp
# Opt level: O1

bool __thiscall ON_Bitmap::Read(ON_Bitmap *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  int major_version;
  int minor_version;
  int local_20 [2];
  
  bVar2 = false;
  local_20[0] = 0;
  local_20[1] = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(archive,0x40008000,local_20,local_20 + 1);
  if (bVar1) {
    if (local_20[0] == 1) {
      ON_ModelComponent::ReadModelComponentAttributes(&this->super_ON_ModelComponent,archive);
      bVar1 = ON_FileReference::Read(&this->m_file_reference,archive);
    }
    else {
      bVar1 = false;
    }
    bVar2 = ON_BinaryArchive::EndRead3dmChunk(archive);
    bVar2 = (bool)(bVar2 & bVar1);
  }
  return bVar2;
}

Assistant:

bool ON_Bitmap::Read(ON_BinaryArchive& archive)
{
  int major_version = 0;
  int minor_version = 0;
  if (!archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK, &major_version, &minor_version))
    return false;

  bool rc = false;
  for (;;)
  {
    if (1 != major_version)
      break;
    ON_ModelComponent::ReadModelComponentAttributes(archive);
    if (!m_file_reference.Read(archive))
      break;

    rc = true;
    break;
  }

  if (!archive.EndRead3dmChunk())
    rc = false;

  return rc;
}